

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitAssignment(ParseNode *asgnNode,ParseNode *lhs,RegSlot rhsLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  Symbol *sym_00;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint uVar4;
  PropertyId propertySlot;
  RegSlot instanceSlot;
  uint uVar5;
  ParseNodeVar *pPVar6;
  undefined4 *puVar7;
  ParseNodeName *pPVar8;
  ParseNodeBin *pPVar9;
  ParseNodeSuperReference *pPVar10;
  ByteCodeWriter *pBVar11;
  RegSlot local_58;
  RegSlot targetLocation;
  uint cacheId_1;
  OpCode stFldOpCode;
  uint cacheId;
  RegSlot tmpReg;
  PropertyId propertyId;
  ParseNodeName *pnodeNameLhs;
  Symbol *sym;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot rhsLocation_local;
  ParseNode *lhs_local;
  ParseNode *asgnNode_local;
  
  uVar4 = (uint)lhs->nop;
  if (uVar4 == 1) {
    pPVar8 = ParseNode::AsParseNodeName(lhs);
    bVar2 = ParseNodeName::IsSpecialName(pPVar8);
    if (bVar2) {
      pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
      Js::ByteCodeWriter::W1(pBVar11,RuntimeReferenceError,0x1390);
    }
    else {
      ByteCodeGenerator::EmitPropStore
                (byteCodeGenerator,rhsLocation,pPVar8->sym,pPVar8->pid,funcInfo,false,false,false,
                 false);
    }
  }
  else if (uVar4 - 0x19 < 2) {
    pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::W1(pBVar11,RuntimeReferenceError,0x1390);
  }
  else if (uVar4 == 0x30) {
    pPVar9 = ParseNode::AsParseNodeBin(lhs);
    pPVar8 = ParseNode::AsParseNodeName(pPVar9->pnode2);
    propertySlot = ParseNodeName::PropertyIdFromNameNode(pPVar8);
    pPVar9 = ParseNode::AsParseNodeBin(lhs);
    bVar2 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
    if (bVar2) {
      pPVar10 = ParseNode::AsParseNodeSuperReference(lhs);
      Emit((ParseNode *)pPVar10->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
      pPVar9 = ParseNode::AsParseNodeBin(lhs);
      instanceSlot = ByteCodeGenerator::EmitLdObjProto
                               (byteCodeGenerator,LdHomeObjProto,pPVar9->pnode1->location,funcInfo);
      pPVar10 = ParseNode::AsParseNodeSuperReference(lhs);
      FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar10->pnodeThis);
      uVar5 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instanceSlot,propertySlot,false,true);
      bVar2 = FuncInfo::GetIsStrictMode(funcInfo);
      OVar3 = StSuperFld;
      if (bVar2) {
        OVar3 = StSuperFldStrict;
      }
      pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
      pPVar10 = ParseNode::AsParseNodeSuperReference(lhs);
      Js::ByteCodeWriter::PatchablePropertyWithThisPtr
                (pBVar11,OVar3,rhsLocation,instanceSlot,
                 (pPVar10->pnodeThis->super_ParseNodeName).super_ParseNode.location,uVar5,false,true
                );
    }
    else {
      pPVar9 = ParseNode::AsParseNodeBin(lhs);
      uVar5 = FuncInfo::FindOrAddInlineCacheId
                        (funcInfo,pPVar9->pnode1->location,propertySlot,false,true);
      pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
      OVar3 = ByteCodeGenerator::GetStFldOpCode
                        (funcInfo,false,false,false,false,
                         (bool)(byteCodeGenerator->forceStrictModeForClassComputedPropertyName & 1))
      ;
      pPVar9 = ParseNode::AsParseNodeBin(lhs);
      Js::ByteCodeWriter::PatchableProperty
                (pBVar11,OVar3,rhsLocation,pPVar9->pnode1->location,uVar5,false,true);
    }
  }
  else if (uVar4 == 0x3e) {
    pPVar9 = ParseNode::AsParseNodeBin(lhs);
    local_58 = pPVar9->pnode1->location;
    pPVar9 = ParseNode::AsParseNodeBin(lhs);
    bVar2 = ByteCodeGenerator::IsSuper(pPVar9->pnode1);
    if (bVar2) {
      pPVar10 = ParseNode::AsParseNodeSuperReference(lhs);
      Emit((ParseNode *)pPVar10->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
      pPVar10 = ParseNode::AsParseNodeSuperReference(lhs);
      FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar10->pnodeThis);
      local_58 = ByteCodeGenerator::EmitLdObjProto
                           (byteCodeGenerator,LdHomeObjProto,local_58,funcInfo);
    }
    pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
    OVar3 = ByteCodeGenerator::GetStElemIOpCode(funcInfo);
    pPVar9 = ParseNode::AsParseNodeBin(lhs);
    Js::ByteCodeWriter::Element
              (pBVar11,OVar3,rhsLocation,local_58,pPVar9->pnode2->location,false,false);
  }
  else if (uVar4 - 0x51 < 3) {
    pPVar6 = ParseNode::AsParseNodeVar(lhs);
    sym_00 = pPVar6->sym;
    if (sym_00 == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1c31,"(sym != nullptr)","sym != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ByteCodeGenerator::EmitPropStore
              (byteCodeGenerator,rhsLocation,sym_00,(IdentPtr)0x0,funcInfo,lhs->nop == knopLetDecl,
               lhs->nop == knopConstDecl,false,false);
  }
  else {
    if (uVar4 == 0x70) {
      if (asgnNode != (ParseNode *)0x0) {
        pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Reg2(pBVar11,Ld_A,asgnNode->location,rhsLocation);
      }
      EmitDestructuredObject(lhs,rhsLocation,byteCodeGenerator,funcInfo);
      return;
    }
    if (uVar4 == 0x72) {
      if (asgnNode != (ParseNode *)0x0) {
        pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
        Js::ByteCodeWriter::Reg2(pBVar11,Ld_A,asgnNode->location,rhsLocation);
      }
      EmitDestructuredArray(lhs,rhsLocation,byteCodeGenerator,funcInfo);
      return;
    }
    pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::W1(pBVar11,RuntimeReferenceError,0x1390);
  }
  if ((asgnNode != (ParseNode *)0x0) && (asgnNode->location != rhsLocation)) {
    pBVar11 = ByteCodeGenerator::Writer(byteCodeGenerator);
    Js::ByteCodeWriter::Reg2(pBVar11,Ld_A,asgnNode->location,rhsLocation);
  }
  return;
}

Assistant:

void EmitAssignment(
    ParseNode *asgnNode,
    ParseNode *lhs,
    Js::RegSlot rhsLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    switch (lhs->nop)
    {
        // assignment to a local or global variable
    case knopVarDecl:
    case knopLetDecl:
    case knopConstDecl:
    {
        Symbol *sym = lhs->AsParseNodeVar()->sym;
        Assert(sym != nullptr);
        byteCodeGenerator->EmitPropStore(rhsLocation, sym, nullptr, funcInfo, lhs->nop == knopLetDecl, lhs->nop == knopConstDecl);
        break;
    }

    case knopName:
    {
        // Special names like 'this' or 'new.target' cannot be assigned to
        ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
        if (pnodeNameLhs->IsSpecialName())
        {
            byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        }
        else
        {
            byteCodeGenerator->EmitPropStore(rhsLocation, pnodeNameLhs->sym, pnodeNameLhs->pid, funcInfo);
        }
        break;
    }

    // x.y =
    case knopDot:
    {
        // PutValue(x, "y", rhs)
        Js::PropertyId propertyId = lhs->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, lhs->AsParseNodeBin()->pnode1->location, funcInfo);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            uint cacheId = funcInfo->FindOrAddInlineCacheId(tmpReg, propertyId, false, true);
            Js::OpCode stFldOpCode = funcInfo->GetIsStrictMode() ? Js::OpCode::StSuperFldStrict : Js::OpCode::StSuperFld;
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(stFldOpCode, rhsLocation, tmpReg, lhs->AsParseNodeSuperReference()->pnodeThis->location, cacheId);
        }
        else
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(lhs->AsParseNodeBin()->pnode1->location, propertyId, false, true);
            byteCodeGenerator->Writer()->PatchableProperty(
                ByteCodeGenerator::GetStFldOpCode(funcInfo, false, false, false, false, byteCodeGenerator->forceStrictModeForClassComputedPropertyName), rhsLocation, lhs->AsParseNodeBin()->pnode1->location, cacheId);
        }

        break;
    }

    case knopIndex:
    {
        Js::RegSlot targetLocation = lhs->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            // We need to emit the 'this' node for the super reference even if we aren't planning to use the 'this' value.
            // This is because we might be in a derived class constructor where we haven't yet called super() to bind the 'this' value.
            // See ecma262 abstract operation 'MakeSuperPropertyReference'
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            targetLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, targetLocation, funcInfo);
        }

        byteCodeGenerator->Writer()->Element(
            ByteCodeGenerator::GetStElemIOpCode(funcInfo),
            rhsLocation, targetLocation, lhs->AsParseNodeBin()->pnode2->location);

        break;
    }

    case knopObjectPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredObject(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArrayPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredArray(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArray:
    case knopObject:
        // Assignment to array/object can get through to byte code gen when the parser fails to convert destructuring
        // assignment to pattern (because of structural mismatch between LHS & RHS?). Revisit when we nail
        // down early vs. runtime errors for destructuring.
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;

    default:
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;
    }

    if (asgnNode != nullptr)
    {
        // We leave it up to the caller to pass this node only if the assignment expression is used.
        if (asgnNode->location != rhsLocation)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
    }
}